

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_test.c
# Opt level: O2

bool_t ecpTest(void)

{
  octet *poVar1;
  word *pwVar2;
  octet *buf2;
  undefined8 uVar3;
  bool_t bVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  qr_o *r;
  word d;
  size_t local_10f0;
  size_t local_10e8;
  octet local_10e0 [8];
  octet t [160];
  octet state [2048];
  octet stack [2048];
  uint uVar10;
  
  sVar5 = gfpCreate_keep(0x20);
  sVar6 = ecpCreateJ_keep(4);
  sVar7 = gfpCreate_deep(0x20);
  uVar9 = 0;
  uVar10 = 0;
  if (sVar7 < 0x801 && sVar6 + sVar5 < 0x801) {
    hexToRev(t,p);
    r = (qr_o *)(state + sVar6);
    bVar4 = gfpCreate(r,t,0x20,stack);
    if (bVar4 != 0) {
      hexToRev(t,a);
      poVar1 = t + 0x20;
      hexToRev(poVar1,b);
      sVar6 = ecpCreateJ_deep(4,sVar7);
      if (sVar6 < 0x801) {
        bVar4 = ecpCreateJ((ec_o *)state,r,t,poVar1,stack);
        uVar9 = uVar10;
        if (bVar4 != 0) {
          hexToRev(t,xbase);
          hexToRev(poVar1,ybase);
          hexToRev(t + 0x40,q);
          sVar6 = ecCreateGroup_deep(sVar7);
          if (sVar6 < 0x801) {
            poVar1 = t + 0x20;
            bVar4 = ecCreateGroup((ec_o *)state,t,poVar1,t + 0x40,0x20,1,stack);
            if (bVar4 != 0) {
              uVar9 = 0;
              objAppend(state,r,0);
              sVar6 = ecpIsValid_deep(4,sVar7);
              if (sVar6 < 0x801) {
                bVar4 = ecpIsValid((ec_o *)state,stack);
                if (bVar4 != 0) {
                  sVar6 = ecpSeemsValidGroup_deep(4,sVar7);
                  if (sVar6 < 0x801) {
                    bVar4 = ecpSeemsValidGroup((ec_o *)state,stack);
                    if (bVar4 != 0) {
                      sVar6 = ecpIsSafeGroup_deep(4);
                      if (sVar6 < 0x801) {
                        bVar4 = ecpIsSafeGroup((ec_o *)state,0x28,stack);
                        if (bVar4 != 0) {
                          sVar6 = ecHasOrderA_deep(4,state._72_8_,state._168_8_,4);
                          if (sVar6 < 0x801) {
                            bVar4 = ecHasOrderA((word *)state._48_8_,(ec_o *)state,
                                                (word *)state._56_8_,4,stack);
                            if ((bVar4 != 0) && (0xffffffffffffff5e < state._72_8_ * 0x20 - 0x61U))
                            {
                              local_10e0[0] = state[0xa8];
                              local_10e0[1] = state[0xa9];
                              local_10e0[2] = state[0xaa];
                              local_10e0[3] = state[0xab];
                              local_10e0[4] = state[0xac];
                              local_10e0[5] = state[0xad];
                              local_10e0[6] = state[0xae];
                              local_10e0[7] = state[0xaf];
                              local_10e8 = ecpIsOnA_deep(4,sVar7);
                              local_10f0 = ecpAddAA_deep(4,sVar7);
                              sVar6 = ecpSubAA_deep(4,sVar7);
                              sVar8 = ecMulA_deep(4,state._72_8_,state._168_8_,1);
                              uVar9 = 0;
                              sVar6 = utilMax(5,local_10e0,local_10e8,local_10f0,sVar6,sVar8);
                              if (sVar6 < 0x801) {
                                d = 3;
                                bVar4 = ecpIsOnA((word *)state._48_8_,(ec_o *)state,stack);
                                if (bVar4 != 0) {
                                  bVar4 = ecpAddAA((word *)t,(word *)state._48_8_,
                                                   (word *)state._48_8_,(ec_o *)state,stack);
                                  if (bVar4 != 0) {
                                    bVar4 = ecpAddAA((word *)t,(word *)t,(word *)state._48_8_,
                                                     (ec_o *)state,stack);
                                    if (bVar4 != 0) {
                                      bVar4 = ecpAddAA((word *)(t + 0x40),(word *)state._48_8_,
                                                       (word *)state._48_8_,(ec_o *)state,stack);
                                      if (bVar4 != 0) {
                                        pwVar2 = (word *)(t + 0x40);
                                        bVar4 = ecpAddAA(pwVar2,pwVar2,pwVar2,(ec_o *)state,stack);
                                        if (bVar4 != 0) {
                                          bVar4 = ecpSubAA((word *)(t + 0x40),(word *)(t + 0x40),
                                                           (word *)state._48_8_,(ec_o *)state,stack)
                                          ;
                                          if (bVar4 != 0) {
                                            bVar4 = memEq(t,t + 0x40,8);
                                            if (bVar4 != 0) {
                                              pwVar2 = (word *)(t + 0x40);
                                              ecpNegA(pwVar2,pwVar2,(ec_o *)state);
                                              bVar4 = ecpAddAA(pwVar2,(word *)t,pwVar2,(ec_o *)state
                                                               ,stack);
                                              if (bVar4 == 0) {
                                                bVar4 = ecMulA((word *)(t + 0x40),
                                                               (word *)state._48_8_,(ec_o *)state,&d
                                                               ,1,stack);
                                                if (bVar4 != 0) {
                                                  bVar4 = memEq(t,t + 0x40,8);
                                                  if ((((bVar4 != 0) && (state._88_8_ != 0)) &&
                                                      (state._160_8_ != 0)) && (state._96_8_ != 0))
                                                  {
                                                    buf2 = t + 0x40;
                                                    (*(code *)state._88_8_)
                                                              (buf2,state._48_8_,state,stack);
                                                    (*(code *)state._160_8_)(buf2,buf2,state,stack);
                                                    (*(code *)state._96_8_)(buf2,buf2,state,stack);
                                                    bVar4 = memEq(t,buf2,8);
                                                    if (bVar4 != 0) {
                                                      memMove(r,(void *)state._24_8_,sVar5);
                                                      hexToRev(t,a);
                                                      t[0] = t[0] + 0xff;
                                                      hexToRev(poVar1,b);
                                                      sVar5 = ecpCreateJ_deep(4,sVar7);
                                                      if (sVar5 < 0x801) {
                                                        bVar4 = ecpCreateJ((ec_o *)state,r,t,poVar1,
                                                                           stack);
                                                        if (bVar4 != 0) {
                                                          uVar9 = 0;
                                                          objAppend(state,r,0);
                                                          hexToRev(t,xbase);
                                                          hexToRev(poVar1,ybase);
                                                          u64From((u64 *)state._48_8_,t,0x20);
                                                          u64From((u64 *)(state._48_8_ + 0x20),
                                                                  poVar1,0x20);
                                                          uVar3 = state._168_8_;
                                                          if (0xffffffffffffff5e <
                                                              state._72_8_ * 0x20 - 0x61U) {
                                                            sVar5 = ecpIsOnA_deep(4,sVar7);
                                                            sVar6 = ecpAddAA_deep(4,sVar7);
                                                            sVar7 = ecpSubAA_deep(4,sVar7);
                                                            sVar8 = ecMulA_deep(4,state._72_8_,
                                                                                state._168_8_,1);
                                                            uVar9 = 0;
                                                            sVar5 = utilMax(5,uVar3,sVar5,sVar6,
                                                                            sVar7,sVar8);
                                                            if (sVar5 < 0x801) {
                                                              d = 3;
                                                              bVar4 = ecpIsOnA((word *)state._48_8_,
                                                                               (ec_o *)state,stack);
                                                              if (bVar4 != 0) {
                                                                bVar4 = ecpAddAA((word *)t,
                                                                                 (word *)state.
                                                  _48_8_,(word *)state._48_8_,(ec_o *)state,stack);
                                                  if (bVar4 != 0) {
                                                    bVar4 = ecpAddAA((word *)t,(word *)t,
                                                                     (word *)state._48_8_,
                                                                     (ec_o *)state,stack);
                                                    if (bVar4 != 0) {
                                                      bVar4 = ecpAddAA((word *)(t + 0x40),
                                                                       (word *)state._48_8_,
                                                                       (word *)state._48_8_,
                                                                       (ec_o *)state,stack);
                                                      if (bVar4 != 0) {
                                                        pwVar2 = (word *)(t + 0x40);
                                                        bVar4 = ecpAddAA(pwVar2,pwVar2,pwVar2,
                                                                         (ec_o *)state,stack);
                                                        if (bVar4 != 0) {
                                                          bVar4 = ecpSubAA((word *)(t + 0x40),
                                                                           (word *)(t + 0x40),
                                                                           (word *)state._48_8_,
                                                                           (ec_o *)state,stack);
                                                          if (bVar4 != 0) {
                                                            bVar4 = memEq(t,t + 0x40,8);
                                                            if (bVar4 != 0) {
                                                              pwVar2 = (word *)(t + 0x40);
                                                              ecpNegA(pwVar2,pwVar2,(ec_o *)state);
                                                              bVar4 = ecpAddAA(pwVar2,(word *)t,
                                                                               pwVar2,(ec_o *)state,
                                                                               stack);
                                                              if (bVar4 == 0) {
                                                                bVar4 = ecMulA((word *)(t + 0x40),
                                                                               (word *)state._48_8_,
                                                                               (ec_o *)state,&d,1,
                                                                               stack);
                                                                if (bVar4 != 0) {
                                                                  bVar4 = memEq(t,t + 0x40,8);
                                                                  if (((bVar4 != 0) &&
                                                                      (state._88_8_ != 0)) &&
                                                                     ((state._160_8_ != 0 &&
                                                                      (state._96_8_ != 0)))) {
                                                                    poVar1 = t + 0x40;
                                                                    (*(code *)state._88_8_)
                                                                              (poVar1,state._48_8_,
                                                                               state,stack);
                                                                    (*(code *)state._160_8_)
                                                                              (poVar1,poVar1,state,
                                                                               stack);
                                                                    (*(code *)state._96_8_)
                                                                              (poVar1,poVar1,state,
                                                                               stack);
                                                                    bVar4 = memEq(t,poVar1,8);
                                                                    uVar9 = (uint)(bVar4 != 0);
                                                                  }
                                                                }
                                                              }
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar9;
}

Assistant:

bool_t ecpTest()
{
	// размерности
	const size_t n = W_OF_O(no);
	const size_t f_keep = gfpCreate_keep(no);
	const size_t ec_keep = ecpCreateJ_keep(n);
	const size_t f_deep = gfpCreate_deep(no);
	// состояние и стек
	octet state[2048];
	octet stack[2048];
	octet t[32 * 5];
	// поле и эк
	qr_o* f;
	ec_o* ec;
	// подготовить память
	if (sizeof(state) < f_keep + ec_keep ||
		sizeof(stack) < f_deep ||
		sizeof(t) < 3 * no)
		return FALSE;
	// создать f = GF(p)
	hexToRev(t, p);
	f = (qr_o*)(state + ec_keep);
	if (!gfpCreate(f, t, no, stack))
		return FALSE;
	// создать ec = EC_{ab}(f)
	hexToRev(t, a), hexToRev(t + no, b);
	ec = (ec_o*)state;
	if (sizeof(stack) < ecpCreateJ_deep(n, f_deep) ||
		!ecpCreateJ(ec, f, t, t + no, stack))
		return FALSE;
	// создать группу точек ec
	hexToRev(t, xbase), hexToRev(t + no, ybase), hexToRev(t + 2 * no, q);
	if (sizeof(stack) < ecCreateGroup_deep(f_deep) ||
		!ecCreateGroup(ec, t, t + no, t + 2 * no, no, cofactor, stack))
		return FALSE;
	// присоединить f к ec
	objAppend(ec, f, 0);
	// корректная кривая?
	if (sizeof(stack) < ecpIsValid_deep(n, f_deep) ||
		!ecpIsValid(ec, stack))
		return FALSE;
	// корректная группа?
	if (sizeof(stack) < ecpSeemsValidGroup_deep(n, f_deep) ||
		!ecpSeemsValidGroup(ec, stack))
		return FALSE;
	// надежная группа?
	if (sizeof(stack) < ecpIsSafeGroup_deep(n) ||
		!ecpIsSafeGroup(ec, 40, stack))
		return FALSE;
	// базовая точка имеет порядок q?
	if (sizeof(stack) < ecHasOrderA_deep(n, ec->d, ec->deep, n) ||
		!ecHasOrderA(ec->base, ec, ec->order, n, stack))
		return FALSE;
	// утроить базовую точку разными способами
	if (sizeof(t) < (2 + ec->d) * no ||
		sizeof(stack) < utilMax(5,
			ec->deep,
			ecpIsOnA_deep(n, f_deep),
			ecpAddAA_deep(n, f_deep),
			ecpSubAA_deep(n, f_deep),
			ecMulA_deep(n, ec->d, ec->deep, 1)))
		return FALSE;
	{
		word* pts = (word*)t;
		word d = 3;
		// удвоить и сложить
		if (!ecpIsOnA(ec->base, ec, stack) ||
			!ecpAddAA(pts, ec->base, ec->base, ec, stack) ||
			!ecpAddAA(pts, pts, ec->base, ec, stack))
			return FALSE;
		// дважды удвоить и вычесть
		if (!ecpAddAA(pts + 2 * n, ec->base, ec->base, ec, stack) ||
			!ecpAddAA(pts + 2 * n, pts + 2 * n, pts + 2 * n, ec, stack) ||
			!ecpSubAA(pts + 2 * n, pts + 2 * n, ec->base, ec, stack) ||
			!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
		ecpNegA(pts + 2 * n, pts + 2 * n, ec);
		if (ecpAddAA(pts + 2 * n, pts, pts + 2 * n, ec, stack))
			return FALSE;
		// вычислить кратную точку
		if (!ecMulA(pts + 2 * n, ec->base, ec, &d, 1, stack) ||
			!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
		// утроить напрямую
		if (!ec->froma || !ec->tpl || !ec->toa)
			return FALSE;
		ec->froma(pts + 2 * n, ec->base, ec, stack);
		ec->tpl(pts + 2 * n, pts + 2 * n, ec, stack);
		ec->toa(pts + 2 * n, pts + 2 * n, ec, stack);
		if (!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
	}
	// вывести f = GF(p) за пределы ec
	f = (qr_o*)(state + ec_keep);
	memMove(f, objPtr(ec, 0, qr_o), f_keep);
	// создать ec = EC_{a-1, b}(f)
	hexToRev(t, a), --t[0], hexToRev(t + no, b);
	ec = (ec_o*)state;
	if (sizeof(stack) < ecpCreateJ_deep(n, f_deep) ||
		!ecpCreateJ(ec, f, t, t + no, stack))
		return FALSE;
	// присоединить f к ec
	objAppend(ec, f, 0);
	// точка (xbase = 0, ybase) все еще лежит на ec: ybase^2 = b
	hexToRev(t, xbase), hexToRev(t + no, ybase);
	wwFrom(ec->base, t, no), wwFrom(ec->base + n, t + no, no);
	ASSERT(wwIsZero(ec->base, n));
	// утроить базовую точку разными способами
	if (sizeof(t) < (2 + ec->d) * no ||
		sizeof(stack) < utilMax(5,
			ec->deep,
			ecpIsOnA_deep(n, f_deep),
			ecpAddAA_deep(n, f_deep),
			ecpSubAA_deep(n, f_deep),
			ecMulA_deep(n, ec->d, ec->deep, 1)))
		return FALSE;
	{
		word* pts = (word*)t;
		word d = 3;
		// удвоить и сложить
		if (!ecpIsOnA(ec->base, ec, stack) ||
			!ecpAddAA(pts, ec->base, ec->base, ec, stack) ||
			!ecpAddAA(pts, pts, ec->base, ec, stack))
			return FALSE;
		// дважды удвоить и вычесть
		if (!ecpAddAA(pts + 2 * n, ec->base, ec->base, ec, stack) ||
			!ecpAddAA(pts + 2 * n, pts + 2 * n, pts + 2 * n, ec, stack) ||
			!ecpSubAA(pts + 2 * n, pts + 2 * n, ec->base, ec, stack) ||
			!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
		ecpNegA(pts + 2 * n, pts + 2 * n, ec);
		if (ecpAddAA(pts + 2 * n, pts, pts + 2 * n, ec, stack))
			return FALSE;
		// вычислить кратную точку
		if (!ecMulA(pts + 2 * n, ec->base, ec, &d, 1, stack) ||
			!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
		// утроить напрямую
		if (!ec->froma || !ec->tpl || !ec->toa)
			return FALSE;
		ec->froma(pts + 2 * n, ec->base, ec, stack);
		ec->tpl(pts + 2 * n, pts + 2 * n, ec, stack);
		ec->toa(pts + 2 * n, pts + 2 * n, ec, stack);
		if (!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
	}
	// все нормально
	return TRUE;
}